

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_VisMF.cpp
# Opt level: O3

void amrex::VisMF::FindOffsets
               (FabArray<amrex::FArrayBox> *mf,string *filePrefix,Header *hdr,Version param_4,
               NFilesIter *nfi,MPI_Comm comm)

{
  _Rb_tree_color _Var1;
  element_type *peVar2;
  iterator __position;
  pointer piVar3;
  FabArray<amrex::FArrayBox> *pFVar4;
  Format FVar5;
  int iVar6;
  FABio *pFVar7;
  long lVar8;
  vector<int,std::allocator<int>> *this;
  _Base_ptr p_Var9;
  pointer pVVar10;
  int iVar11;
  long lVar12;
  pointer pVVar13;
  pointer piVar14;
  _Base_ptr p_Var15;
  long lVar16;
  _Base_ptr p_Var17;
  _Base_ptr p_Var18;
  string whichFileName;
  FArrayBox tempFab;
  Vector<long,_std::allocator<long>_> currentOffset;
  Vector<long,_std::allocator<long>_> fabHeaderBytes;
  map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  rankBoxOrder;
  RealDescriptor *local_2c0;
  vector<int,_std::allocator<int>_> local_2b8;
  long local_2a0;
  FabArray<amrex::FArrayBox> *local_298;
  long local_290;
  undefined1 *local_288;
  undefined8 local_280;
  undefined1 local_278;
  undefined7 uStack_277;
  undefined1 local_268 [52];
  uint local_234;
  NFilesIter *local_218;
  string local_210;
  vector<long,_std::allocator<long>_> local_1f0;
  vector<long,_std::allocator<long>_> local_1d8;
  string *local_1c0;
  _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
  local_1b8 [2];
  ios_base local_138 [264];
  
  iVar11 = 0;
  if (nfi->useStaticSetSelection == false) {
    iVar11 = nfi->coordinatorProc;
  }
  local_1c0 = filePrefix;
  FVar5 = FArrayBox::getFormat();
  if ((FVar5 != FAB_ASCII) && (FVar5 = FArrayBox::getFormat(), FVar5 != FAB_8BIT)) {
    FArrayBox::getDataDescriptor();
    pFVar7 = FArrayBox::getFABio();
    iVar6 = RealDescriptor::numBytes(local_2c0);
    if (iVar11 == 0) {
      local_290 = CONCAT44(local_290._4_4_,iVar6);
      local_2a0 = (long)(mf->super_FabArrayBase).n_comp;
      peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_1b8[0]._M_impl._0_8_ = 0;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1d8,
                 ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7,
                 (value_type_conflict3 *)local_1b8,(allocator_type *)local_268);
      local_288 = &local_278;
      local_280 = 0;
      local_278 = 0;
      local_1b8[0]._M_impl._0_8_ = 0;
      std::vector<long,_std::allocator<long>_>::vector
                (&local_1f0,1,(value_type_conflict3 *)local_1b8,(allocator_type *)local_268);
      peVar2 = (mf->super_FabArrayBase).boxarray.m_ref.
               super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      lVar8 = (long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                    super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                    super__Vector_impl_data._M_finish -
              *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data;
      local_298 = mf;
      if ((hdr->m_vers == 1) && (0 < lVar8)) {
        lVar16 = 0;
        do {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          FabArrayBase::fabbox((Box *)&local_210,&local_298->super_FabArrayBase,(int)lVar16);
          FArrayBox::FArrayBox
                    ((FArrayBox *)local_268,(Box *)&local_210,(int)local_2a0,false,false,
                     (Arena *)0x0);
          (*pFVar7->_vptr_FABio[6])
                    (pFVar7,&local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (BaseFab<double> *)local_268,(ulong)local_234);
          lVar8 = std::ostream::tellp();
          local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar16] = lVar8;
          local_268._0_8_ = &PTR__BaseFab_00712bd8;
          BaseFab<double>::clear((BaseFab<double> *)local_268);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
          lVar16 = lVar16 + 1;
          peVar2 = (local_298->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          lVar8 = (long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                        super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                            super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                            super__Vector_impl_data;
          lVar12 = (lVar8 >> 2) * 0x6db6db6db6db6db7;
        } while (lVar12 - lVar16 != 0 && lVar16 <= lVar12);
      }
      pFVar4 = local_298;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_268._0_8_ = local_268._0_8_ & 0xffffffff00000000;
      local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_right =
           local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_left;
      if (0 < lVar8) {
        lVar8 = 0;
        do {
          local_210._M_dataplus._M_p._0_4_ =
               *(undefined4 *)
                (*(long *)&(((pFVar4->super_FabArrayBase).distributionMap.m_ref.
                             super___shared_ptr<amrex::DistributionMapping::Ref,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->m_pmap).super_vector<int,_std::allocator<int>_>.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl + lVar8 * 4);
          this = (vector<int,std::allocator<int>> *)
                 std::
                 map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                 ::operator[]((map<int,_amrex::Vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
                               *)local_1b8,(key_type *)&local_210);
          __position._M_current = *(int **)(this + 8);
          if (__position._M_current == *(int **)(this + 0x10)) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      (this,__position,(int *)local_268);
          }
          else {
            *__position._M_current = local_268._0_4_;
            *(int **)(this + 8) = __position._M_current + 1;
          }
          iVar11 = local_268._0_4_ + 1;
          local_268._0_4_ = iVar11;
          peVar2 = (pFVar4->super_FabArrayBase).boxarray.m_ref.
                   super___shared_ptr<amrex::BARef,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          lVar8 = (long)iVar11;
          lVar16 = ((long)(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>.
                          super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    *(long *)&(peVar2->m_abox).super_vector<amrex::Box,_std::allocator<amrex::Box>_>
                              .super__Vector_base<amrex::Box,_std::allocator<amrex::Box>_>._M_impl.
                              super__Vector_impl_data >> 2) * 0x6db6db6db6db6db7;
        } while (lVar16 - lVar8 != 0 && lVar8 <= lVar16);
      }
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish = (pointer)0x0;
      local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      if (nfi->useStaticSetSelection == false) {
        NFilesIter::FileNumbersWritten((Vector<int,_std::allocator<int>_> *)local_268,nfi);
        piVar3 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
        piVar14 = local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)local_268._0_8_;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)local_268._8_8_;
        local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)local_268._16_8_;
        local_268._0_8_ = (_func_int **)0x0;
        local_268._8_8_ = (Arena *)0x0;
        local_268._16_8_ = (double *)0x0;
        if (((_func_int **)piVar14 != (_func_int **)0x0) &&
           (operator_delete(piVar14,(long)piVar3 - (long)piVar14),
           (_func_int **)local_268._0_8_ != (_func_int **)0x0)) {
          operator_delete((void *)local_268._0_8_,local_268._16_8_ - local_268._0_8_);
        }
      }
      else {
        if (nfi->useSparseFPP == true) {
          std::vector<int,_std::allocator<int>_>::resize(&local_2b8,1);
        }
        else {
          std::vector<int,_std::allocator<int>_>::resize(&local_2b8,1);
        }
        *local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start = 0;
      }
      pVVar10 = (nfi->fileNumbersWriteOrder).
                super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                .
                super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pVVar13 = (nfi->fileNumbersWriteOrder).
                super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                .
                super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      if (pVVar13 != pVVar10 && -1 < (long)pVVar13 - (long)pVVar10) {
        local_2a0 = local_2a0 * (int)local_290;
        lVar8 = 0;
        local_218 = nfi;
        do {
          piVar14 = pVVar10[lVar8].super_vector<int,_std::allocator<int>_>.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start;
          piVar3 = pVVar10[lVar8].super_vector<int,_std::allocator<int>_>.
                   super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                   _M_finish;
          if (piVar3 != piVar14 && -1 < (long)piVar3 - (long)piVar14) {
            lVar16 = 0;
            local_290 = lVar8;
            do {
              if (local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0)
              {
                iVar11 = piVar14[lVar16];
                p_Var18 = &local_1b8[0]._M_impl.super__Rb_tree_header._M_header;
                p_Var9 = local_1b8[0]._M_impl.super__Rb_tree_header._M_header._M_parent;
                do {
                  p_Var15 = p_Var9;
                  p_Var17 = p_Var18;
                  _Var1 = p_Var15[1]._M_color;
                  p_Var18 = p_Var15;
                  if ((int)_Var1 < iVar11) {
                    p_Var18 = p_Var17;
                  }
                  p_Var9 = (&p_Var15->_M_left)[(int)_Var1 < iVar11];
                } while ((&p_Var15->_M_left)[(int)_Var1 < iVar11] != (_Base_ptr)0x0);
                if ((_Rb_tree_header *)p_Var18 != &local_1b8[0]._M_impl.super__Rb_tree_header) {
                  if ((int)_Var1 < iVar11) {
                    p_Var15 = p_Var17;
                  }
                  if ((int)p_Var15[1]._M_color <= iVar11) {
                    iVar11 = *(int *)((long)local_2b8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                     (long)iVar11 * 4);
                    Concatenate(&local_210,local_1c0,iVar11,NFilesIter::minDigits);
                    BaseName((string *)local_268,&local_210);
                    std::__cxx11::string::operator=((string *)&local_288,(string *)local_268);
                    if ((undefined1 *)local_268._0_8_ != local_268 + 0x10) {
                      operator_delete((void *)local_268._0_8_,local_268._16_8_ + 1);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                    local_210._M_dataplus._M_p._0_4_) != &local_210.field_2) {
                      operator_delete((undefined1 *)
                                      CONCAT44(local_210._M_dataplus._M_p._4_4_,
                                               local_210._M_dataplus._M_p._0_4_),
                                      local_210.field_2._M_allocated_capacity + 1);
                    }
                    p_Var9 = p_Var18[1]._M_parent;
                    if (p_Var18[1]._M_left != p_Var9 && -1 < (long)p_Var18[1]._M_left - (long)p_Var9
                       ) {
                      lVar12 = 0;
                      do {
                        std::__cxx11::string::_M_assign
                                  ((string *)
                                   ((hdr->m_fod).
                                    super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                    .
                                    super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                                   (int)(&p_Var9->_M_color)[lVar12]));
                        _Var1 = (&(p_Var18[1]._M_parent)->_M_color)[lVar12];
                        (hdr->m_fod).
                        super_vector<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        .
                        super__Vector_base<amrex::VisMF::FabOnDisk,_std::allocator<amrex::VisMF::FabOnDisk>_>
                        ._M_impl.super__Vector_impl_data._M_start[(int)_Var1].m_head =
                             local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar11];
                        FabArrayBase::fabbox((Box *)local_268,&local_298->super_FabArrayBase,_Var1);
                        p_Var9 = p_Var18[1]._M_parent;
                        local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar11] =
                             local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start[iVar11] +
                             (long)((local_268._20_4_ - local_268._8_4_) + 1) *
                             (long)((local_268._16_4_ - local_268._4_4_) + 1) *
                             ((local_268._12_4_ - local_268._0_4_) + 1) * local_2a0 +
                             local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                             super__Vector_impl_data._M_start[(int)(&p_Var9->_M_color)[lVar12]];
                        lVar12 = lVar12 + 1;
                      } while (lVar12 < (long)p_Var18[1]._M_left - (long)p_Var9 >> 2);
                    }
                  }
                }
              }
              lVar16 = lVar16 + 1;
              pVVar10 = (local_218->fileNumbersWriteOrder).
                        super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                        .
                        super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              piVar14 = pVVar10[lVar8].super_vector<int,_std::allocator<int>_>.
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start;
            } while (lVar16 < (long)pVVar10[lVar8].super_vector<int,_std::allocator<int>_>.
                                    super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)piVar14 >> 2);
            pVVar13 = (local_218->fileNumbersWriteOrder).
                      super_vector<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                      .
                      super__Vector_base<amrex::Vector<int,_std::allocator<int>_>,_std::allocator<amrex::Vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            lVar8 = local_290;
          }
          lVar8 = lVar8 + 1;
          lVar16 = ((long)pVVar13 - (long)pVVar10 >> 3) * -0x5555555555555555;
        } while (lVar16 - lVar8 != 0 && lVar8 <= lVar16);
      }
      if ((_func_int **)
          local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (_func_int **)0x0) {
        operator_delete(local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_2b8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<int,_std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_amrex::Vector<int,_std::allocator<int>_>_>_>_>
      ::~_Rb_tree(local_1b8);
      if (local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1f0.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      if (local_288 != &local_278) {
        operator_delete(local_288,CONCAT71(uStack_277,local_278) + 1);
      }
      if (local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_start != (pointer)0x0) {
        operator_delete(local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_1d8.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    }
    if (local_2c0 != (RealDescriptor *)0x0) {
      std::default_delete<amrex::RealDescriptor>::operator()
                ((default_delete<amrex::RealDescriptor> *)&local_2c0,local_2c0);
    }
  }
  return;
}

Assistant:

void
VisMF::FindOffsets (const FabArray<FArrayBox> &mf,
                    const std::string &filePrefix,
                    VisMF::Header &hdr,
                    VisMF::Header::Version /*whichVersion*/,
                    NFilesIter &nfi, MPI_Comm comm)
{
//    BL_PROFILE("VisMF::FindOffsets");

    const int myProc(ParallelDescriptor::MyProc(comm));
    const int nProcs(ParallelDescriptor::NProcs(comm));
    int coordinatorProc(ParallelDescriptor::IOProcessorNumber(comm));
    if(nfi.GetDynamic()) {
      coordinatorProc = nfi.CoordinatorProc();
    }

    if(FArrayBox::getFormat() == FABio::FAB_ASCII ||
       FArrayBox::getFormat() == FABio::FAB_8BIT)
    {

#ifdef BL_USE_MPI
    Vector<int> nmtags(nProcs,0);
    Vector<int> offset(nProcs,0);

    const Vector<int> &pmap = mf.DistributionMap().ProcessorMap();

    for(int i(0), N(mf.size()); i < N; ++i) {
        ++nmtags[pmap[i]];
    }

    for(int i(1), N(offset.size()); i < N; ++i) {
        offset[i] = offset[i-1] + nmtags[i-1];
    }

    Vector<Long> senddata(nmtags[myProc]);

    if(senddata.empty()) {
      // Can't let senddata be empty as senddata.dataPtr() will fail.
      senddata.resize(1);
    }

    int ioffset(0);

    for(MFIter mfi(mf); mfi.isValid(); ++mfi) {
      senddata[ioffset++] = hdr.m_fod[mfi.index()].m_head;
    }

    BL_ASSERT(ioffset == nmtags[myProc]);

    Vector<Long> recvdata(mf.size());

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::BeforeCall());

    BL_MPI_REQUIRE( MPI_Gatherv(senddata.dataPtr(),
                                nmtags[myProc],
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                recvdata.dataPtr(),
                                nmtags.dataPtr(),
                                offset.dataPtr(),
                                ParallelDescriptor::Mpi_typemap<Long>::type(),
                                coordinatorProc,
                                comm) );

    BL_COMM_PROFILE(BLProfiler::Gatherv, recvdata.size() * sizeof(Long),
                    myProc, BLProfiler::AfterCall());

    if(myProc == coordinatorProc) {
        Vector<int> cnt(nProcs,0);

        for(int j(0), N(mf.size()); j < N; ++j) {
            const int i(pmap[j]);
            hdr.m_fod[j].m_head = recvdata[offset[i]+cnt[i]];

            const std::string name(NFilesIter::FileName(nOutFiles, filePrefix, i, groupSets));

            hdr.m_fod[j].m_name = VisMF::BaseName(name);

            ++cnt[i];
        }
    }
#endif /*BL_USE_MPI*/


    } else {    // ---- calculate offsets

      auto whichRD = FArrayBox::getDataDescriptor();
      const FABio &fio = FArrayBox::getFABio();
      int whichRDBytes(whichRD->numBytes());
      int nComps(mf.nComp());

      if(myProc == coordinatorProc) {   // ---- calculate offsets
        const BoxArray &mfBA = mf.boxArray();
        const DistributionMapping &mfDM = mf.DistributionMap();
        Vector<Long> fabHeaderBytes(mfBA.size(), 0);
        int nFiles(NFilesIter::ActualNFiles(nOutFiles));
        int whichFileNumber(-1);
        std::string whichFileName;
        Vector<Long> currentOffset(nProcs, 0L);

        if(hdr.m_vers == VisMF::Header::Version_v1) {
          // ---- find the length of the fab header instead of asking the file system
          for(int i(0); i < mfBA.size(); ++i) {
            std::stringstream hss;
            FArrayBox tempFab(mf.fabbox(i), nComps, false);  // ---- no alloc
            fio.write_header(hss, tempFab, tempFab.nComp());
            fabHeaderBytes[i] = static_cast<std::streamoff>(hss.tellp());
          }
        }

        std::map<int, Vector<int> > rankBoxOrder;  // ---- [rank, boxarray index array]
        for(int i(0); i < mfBA.size(); ++i) {
          rankBoxOrder[mfDM[i]].push_back(i);
        }

        Vector<int> fileNumbers;
        if(nfi.GetDynamic()) {
          fileNumbers = nfi.FileNumbersWritten();
        }
        else if(nfi.GetSparseFPP()) {        // if sparse, write to (file number = rank)
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = i;
          }
        }
        else {
          fileNumbers.resize(nProcs);
          for(int i(0); i < nProcs; ++i) {
            fileNumbers[i] = NFilesIter::FileNumber(nFiles, i, groupSets);
          }
        }

        const Vector< Vector<int> > &fileNumbersWriteOrder = nfi.FileNumbersWriteOrder();

        for(int fn(0); fn < fileNumbersWriteOrder.size(); ++fn) {
          for(int ri(0); ri < fileNumbersWriteOrder[fn].size(); ++ri) {
            int rank(fileNumbersWriteOrder[fn][ri]);
            std::map<int, Vector<int> >::iterator rboIter = rankBoxOrder.find(rank);

            if(rboIter != rankBoxOrder.end()) {
              Vector<int> &index = rboIter->second;
              whichFileNumber = fileNumbers[rank];
              whichFileName   = VisMF::BaseName(NFilesIter::FileName(whichFileNumber, filePrefix));

              for(int i(0); i < index.size(); ++i) {
                 hdr.m_fod[index[i]].m_name = whichFileName;
                 hdr.m_fod[index[i]].m_head = currentOffset[whichFileNumber];
                 currentOffset[whichFileNumber] += mf.fabbox(index[i]).numPts() * nComps * whichRDBytes
                                                   + fabHeaderBytes[index[i]];
              }
            }
          }
        }
      }
    }
}